

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adig.c
# Opt level: O0

void print_record(ares_dns_record_t *dnsrec)

{
  ulong local_20;
  size_t alen;
  uchar *abuf;
  ares_dns_record_t *dnsrec_local;
  
  abuf = (uchar *)dnsrec;
  if (global_config.opts.display_comments != ARES_FALSE) {
    print_header(dnsrec);
    print_opt_psuedosection((ares_dns_record_t *)abuf);
  }
  if (global_config.opts.display_question != ARES_FALSE) {
    print_question((ares_dns_record_t *)abuf);
  }
  if (global_config.opts.display_answer != ARES_FALSE) {
    print_section((ares_dns_record_t *)abuf,ARES_SECTION_ANSWER);
  }
  if (global_config.opts.display_additional != ARES_FALSE) {
    print_section((ares_dns_record_t *)abuf,ARES_SECTION_ADDITIONAL);
  }
  if (global_config.opts.display_authority != ARES_FALSE) {
    print_section((ares_dns_record_t *)abuf,ARES_SECTION_AUTHORITY);
  }
  if (global_config.opts.display_stats != ARES_FALSE) {
    alen = 0;
    local_20 = 0;
    ares_dns_write(abuf,&alen,&local_20);
    printf(";; MSG SIZE  rcvd: %d\n\n",local_20 & 0xffffffff);
    ares_free_string(alen);
  }
  return;
}

Assistant:

static void print_record(const ares_dns_record_t *dnsrec)
{
  if (global_config.opts.display_comments) {
    print_header(dnsrec);
    print_opt_psuedosection(dnsrec);
  }

  if (global_config.opts.display_question) {
    print_question(dnsrec);
  }

  if (global_config.opts.display_answer) {
    print_section(dnsrec, ARES_SECTION_ANSWER);
  }

  if (global_config.opts.display_additional) {
    print_section(dnsrec, ARES_SECTION_ADDITIONAL);
  }

  if (global_config.opts.display_authority) {
    print_section(dnsrec, ARES_SECTION_AUTHORITY);
  }

  if (global_config.opts.display_stats) {
    unsigned char *abuf = NULL;
    size_t         alen = 0;
    ares_dns_write(dnsrec, &abuf, &alen);
    printf(";; MSG SIZE  rcvd: %d\n\n", (int)alen);
    ares_free_string(abuf);
  }
}